

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::InitializeEncodingAndFormat
          (LogMessageData *this)

{
  int iVar1;
  LogSeverity severity;
  int32_t value;
  tid_t value_00;
  Span<char> *pSVar2;
  int64_t value_01;
  string_view value_02;
  Time t;
  LogMessageData *this_local;
  
  value_02 = LogEntry::source_filename(&this->entry);
  pSVar2 = encoded_remaining(this);
  EncodeStringTruncate(2,value_02,pSVar2);
  iVar1 = LogEntry::source_line(&this->entry);
  pSVar2 = encoded_remaining(this);
  EncodeVarint(3,iVar1,pSVar2);
  t = LogEntry::timestamp(&this->entry);
  value_01 = ToUnixNanos(t);
  pSVar2 = encoded_remaining(this);
  EncodeVarint(4,value_01,pSVar2);
  severity = LogEntry::log_severity(&this->entry);
  iVar1 = LogEntry::verbosity(&this->entry);
  value = anon_unknown_4::ProtoSeverity(severity,iVar1);
  pSVar2 = encoded_remaining(this);
  EncodeVarint(5,value,pSVar2);
  value_00 = LogEntry::tid(&this->entry);
  pSVar2 = encoded_remaining(this);
  EncodeVarint(6,value_00,pSVar2);
  return;
}

Assistant:

void LogMessage::LogMessageData::InitializeEncodingAndFormat() {
  EncodeStringTruncate(EventTag::kFileName, entry.source_filename(),
                       &encoded_remaining());
  EncodeVarint(EventTag::kFileLine, entry.source_line(), &encoded_remaining());
  EncodeVarint(EventTag::kTimeNsecs, absl::ToUnixNanos(entry.timestamp()),
               &encoded_remaining());
  EncodeVarint(EventTag::kSeverity,
               ProtoSeverity(entry.log_severity(), entry.verbosity()),
               &encoded_remaining());
  EncodeVarint(EventTag::kThreadId, entry.tid(), &encoded_remaining());
}